

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

ssize_t __thiscall
kj::anon_unknown_31::HttpClientAdapter::WebSocketResponseImpl::send
          (WebSocketResponseImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  PromiseNode **ppPVar1;
  char cVar2;
  PromiseFulfiller<kj::HttpClient::WebSocketResponse> *pPVar3;
  HttpHeaders *pHVar4;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar5;
  TransformPromiseNodeBase *this_00;
  WebSocketResponseImpl *this_01;
  void *__child_stack;
  undefined4 in_register_00000034;
  WebSocketResponseImpl *pWVar6;
  undefined4 in_register_00000084;
  __fn *in_R9;
  Own<kj::AsyncInputStream> OVar7;
  char *in_stack_00000008;
  Own<kj::AsyncInputStream> local_148;
  Own<kj::HttpHeaders> headersCopy;
  Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl> local_128;
  OneWayPipe pipe;
  String statusTextCopy;
  undefined1 local_d8 [24];
  TransformPromiseNodeBase *local_c0;
  undefined1 local_b8 [40];
  undefined8 uStack_90;
  HttpHeaders *pHStack_88;
  char local_80;
  Array<char> *local_78;
  Own<kj::_::PromiseNode> local_58;
  Maybe<unsigned_long> local_40;
  StringPtr statusText_local;
  
  pWVar6 = (WebSocketResponseImpl *)CONCAT44(in_register_00000034,__fd);
  statusText_local.content.size_ = CONCAT44(in_register_00000084,__flags);
  statusText_local.content.ptr = (char *)__n;
  str<kj::StringPtr&>(&statusTextCopy,(kj *)&statusText_local,(StringPtr *)__buf);
  HttpHeaders::clone((HttpHeaders *)local_b8,in_R9,__child_stack,(int)__n,
                     (void *)CONCAT44(in_register_00000084,__flags));
  heap<kj::HttpHeaders>((kj *)&headersCopy,(HttpHeaders *)local_b8);
  HttpHeaders::~HttpHeaders((HttpHeaders *)local_b8);
  cVar2 = *in_stack_00000008;
  aVar5 = local_40.ptr.field_1;
  if ((cVar2 == '\x01') &&
     (aVar5.value = ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
                    (in_stack_00000008 + 8))->value,
     ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)(in_stack_00000008 + 8))->value
     == 0)) {
    local_b8._8_4_ = (int)__buf;
    local_b8._16_8_ = statusTextCopy.content.ptr;
    local_b8._24_8_ = statusTextCopy.content.size_;
    local_b8._32_8_ = statusTextCopy.content.disposer;
    statusTextCopy.content.ptr = (char *)0x0;
    statusTextCopy.content.size_ = 0;
    uStack_90 = (RemoveConst<kj::HttpHeaders::Header> *)headersCopy.disposer;
    pHStack_88 = headersCopy.ptr;
    headersCopy.ptr = (HttpHeaders *)0x0;
    local_78 = (Array<char> *)0x0;
    local_b8._0_8_ = pWVar6;
    local_80 = cVar2;
    this_00 = (TransformPromiseNodeBase *)operator_new(0x70);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(Own<kj::_::PromiseNode> *)&pWVar6->task,
               _::
               TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:4458:26),_kj::_::PropagateException>
               ::anon_class_72_5_009bee8d_for_func::operator());
    pHVar4 = pHStack_88;
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0042c368;
    this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)local_b8._0_8_;
    *(undefined4 *)&this_00[1].dependency.disposer = local_b8._8_4_;
    this_00[1].dependency.ptr = (PromiseNode *)local_b8._16_8_;
    this_00[1].continuationTracePtr = (void *)local_b8._24_8_;
    local_b8._16_8_ = 0;
    local_b8._24_8_ = (HttpHeaders *)0x0;
    this_00[2].super_PromiseNode._vptr_PromiseNode = (_func_int **)local_b8._32_8_;
    this_00[2].dependency.disposer = (Disposer *)uStack_90;
    pHStack_88 = (HttpHeaders *)0x0;
    this_00[2].dependency.ptr = (PromiseNode *)pHVar4;
    *(char *)&this_00[2].continuationTracePtr = local_80;
    if (local_80 == '\x01') {
      this_00[3].super_PromiseNode._vptr_PromiseNode = (_func_int **)local_78;
    }
    pipe.in.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl::send(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::{lambda()#1},kj::_::PropagateException>>
          ::instance;
    local_d8._0_8_ =
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl::send(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::{lambda()#1},kj::_::PropagateException>>
          ::instance;
    pipe.in.ptr = (AsyncInputStream *)0x0;
    local_d8._16_8_ =
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl::send(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::{lambda()#1},kj::_::PropagateException>>
          ::instance;
    local_d8._8_8_ = (AsyncInputStream *)0x0;
    local_c0 = this_00;
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_d8);
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&pipe);
    this_01 = (WebSocketResponseImpl *)operator_new(0x28);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)this_01,(Own<kj::_::PromiseNode> *)(local_d8 + 0x10),
               _::IdentityFunc<void>::operator());
    (((Vector<kj::StringPtr> *)&this_01->super_Response)->builder).ptr =
         (StringPtr *)&PTR_onReady_0042c3f0;
    pipe.in.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::_::IdentityFunc<void>,kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl::send(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::{lambda(kj::Exception&&)#1}>>
          ::instance;
    local_d8._0_8_ =
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::_::IdentityFunc<void>,kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl::send(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::{lambda(kj::Exception&&)#1}>>
          ::instance;
    pipe.in.ptr = (AsyncInputStream *)0x0;
    local_128.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::_::IdentityFunc<void>,kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl::send(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::{lambda(kj::Exception&&)#1}>>
          ::instance;
    local_d8._8_8_ = (DelayedEofInputStream *)0x0;
    local_128.ptr = this_01;
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_d8);
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&pipe);
    _::spark<kj::_::Void>((_ *)&local_148,(Own<kj::_::PromiseNode> *)&local_128);
    local_58.ptr = (PromiseNode *)local_148.ptr;
    local_148.ptr = (AsyncInputStream *)0x0;
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_148);
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_128);
    Own<kj::_::PromiseNode>::operator=((Own<kj::_::PromiseNode> *)&pWVar6->task,&local_58);
    Own<kj::_::PromiseNode>::dispose(&local_58);
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)(local_d8 + 0x10));
    (anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl::
    send(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::{lambda()#1}::
    ~Maybe((_lambda___1_ *)local_b8);
    heap<kj::(anonymous_namespace)::NullOutputStream>();
    (this->super_Response)._vptr_Response = (_func_int **)local_b8._0_8_;
    (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)local_b8._8_8_;
    local_b8._8_8_ = (DelayedEofInputStream *)0x0;
    Own<kj::(anonymous_namespace)::NullOutputStream>::~Own
              ((Own<kj::(anonymous_namespace)::NullOutputStream> *)local_b8);
  }
  else {
    local_40.ptr.field_1 = aVar5;
    local_40.ptr.isSet = (bool)cVar2;
    newOneWayPipe(&pipe,&local_40);
    ppPVar1 = &((Own<kj::_::PromiseNode> *)&pWVar6->super_Refcounted)->ptr;
    *(int *)ppPVar1 = *(int *)ppPVar1 + 1;
    local_128.disposer = &(pWVar6->super_Refcounted).super_Disposer;
    local_128.ptr = pWVar6;
    Promise<void>::
    attach<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl>>
              ((Promise<void> *)&local_148,
               (Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl> *)
               &pWVar6->task);
    heap<kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream,kj::Own<kj::AsyncInputStream>,kj::Promise<void>>
              ((kj *)local_b8,&pipe.in,(Promise<void> *)&local_148);
    local_d8._0_8_ = local_b8._0_8_;
    local_d8._8_8_ = local_b8._8_8_;
    local_b8._8_8_ = (DelayedEofInputStream *)0x0;
    Own<kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream>::~Own
              ((Own<kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream> *)local_b8)
    ;
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_148);
    Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl>::~Own(&local_128);
    pPVar3 = (pWVar6->fulfiller).ptr;
    local_b8._0_4_ = (int)__buf;
    local_b8._8_8_ = statusTextCopy.content.ptr;
    if (statusTextCopy.content.size_ == 0) {
      local_b8._8_8_ = (DelayedEofInputStream *)0x33812f;
    }
    local_b8._16_8_ = statusTextCopy.content.size_ + (statusTextCopy.content.size_ == 0);
    local_b8._24_8_ = headersCopy.ptr;
    OVar7 = Own<kj::AsyncInputStream>::attach<kj::String,kj::Own<kj::HttpHeaders>>
                      (&local_148,(String *)local_d8,(Own<kj::HttpHeaders> *)&statusTextCopy);
    local_b8._32_4_ = 1;
    uStack_90 = (RemoveConst<kj::HttpHeaders::Header> *)
                CONCAT44(local_148.disposer._4_4_,local_148.disposer._0_4_);
    pHStack_88 = (HttpHeaders *)local_148.ptr;
    local_148.ptr = (AsyncInputStream *)0x0;
    (**pPVar3->_vptr_PromiseFulfiller)(pPVar3,local_b8,OVar7.ptr);
    OneOf<kj::Own<kj::AsyncInputStream>,_kj::Own<kj::WebSocket>_>::~OneOf
              ((OneOf<kj::Own<kj::AsyncInputStream>,_kj::Own<kj::WebSocket>_> *)(local_b8 + 0x20));
    Own<kj::AsyncInputStream>::dispose(&local_148);
    (this->super_Response)._vptr_Response = (_func_int **)pipe.out.disposer;
    (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)pipe.out.ptr;
    pipe.out.ptr = (AsyncOutputStream *)0x0;
    Own<kj::AsyncInputStream>::dispose((Own<kj::AsyncInputStream> *)local_d8);
    OneWayPipe::~OneWayPipe(&pipe);
  }
  if (headersCopy.ptr != (HttpHeaders *)0x0) {
    headersCopy.ptr = (HttpHeaders *)0x0;
    (**(headersCopy.disposer)->_vptr_Disposer)();
  }
  Array<char>::~Array(&statusTextCopy.content);
  return (ssize_t)this;
}

Assistant:

kj::Own<kj::AsyncOutputStream> send(
        uint statusCode, kj::StringPtr statusText, const HttpHeaders& headers,
        kj::Maybe<uint64_t> expectedBodySize = nullptr) override {
      // The caller of HttpClient is allowed to assume that the statusText and headers remain
      // valid until the body stream is dropped, but the HttpService implementation is allowed to
      // send values that are only valid until send() returns, so we have to copy.
      auto statusTextCopy = kj::str(statusText);
      auto headersCopy = kj::heap(headers.clone());

      if (expectedBodySize.orDefault(1) == 0) {
        // We're not expecting any body. We need to delay reporting completion to the client until
        // the server side has actually returned from the service method, otherwise we may
        // prematurely cancel it.

        task = task.then([this,statusCode,statusTextCopy=kj::mv(statusTextCopy),
                          headersCopy=kj::mv(headersCopy),expectedBodySize]() mutable {
          fulfiller->fulfill({
            statusCode, statusTextCopy, headersCopy.get(),
            kj::Own<AsyncInputStream>(kj::heap<NullInputStream>(expectedBodySize)
                .attach(kj::mv(statusTextCopy), kj::mv(headersCopy)))
          });
        }).eagerlyEvaluate([](kj::Exception&& e) { KJ_LOG(ERROR, e); });
        return kj::heap<NullOutputStream>();
      } else {
        auto pipe = newOneWayPipe(expectedBodySize);

        // Wrap the stream in a wrapper that delays the last read (the one that signals EOF) until
        // the service's request promise has finished.
        kj::Own<AsyncInputStream> wrapper =
            kj::heap<DelayedEofInputStream>(kj::mv(pipe.in), task.attach(kj::addRef(*this)));

        fulfiller->fulfill({
          statusCode, statusTextCopy, headersCopy.get(),
          wrapper.attach(kj::mv(statusTextCopy), kj::mv(headersCopy))
        });
        return kj::mv(pipe.out);
      }
    }